

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void opengv::absolute_pose::modules::upnp_main
               (Matrix<double,_10,_10,_0,_10,_10> *M,Matrix<double,_1,_10,_1,_1,_10> *C,double gamma
               ,vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                *quaternions)

{
  undefined1 auVar1 [16];
  pointer ppVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  long lVar13;
  Matrix<double,_4,_1,_0,_4,_1> *pMVar14;
  bool bVar15;
  ulong uVar16;
  const_iterator __position;
  long lVar17;
  complex<double> *pcVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 extraout_var [56];
  double dVar25;
  double dVar27;
  undefined1 auVar26 [16];
  Vector4d quaternion;
  Transpose<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> destT;
  Matrix<std::complex<double>,_16,_16,_0,_16,_16> V;
  Matrix<double,_16,_16,_0,_16,_16> Action;
  EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> Eig;
  undefined1 local_4580 [16];
  undefined1 auStack_4570 [40];
  Matrix<double,_1,_10,_1,_1,_10> *local_4548;
  Matrix<double,_10,_10,_0,_10,_10> *local_4540;
  double local_4538;
  Scalar local_4530;
  Transpose<const_Eigen::Transpose<Eigen::Matrix<double,_10,_1,_0,_10,_1>_>_> local_4528;
  Transpose<const_Eigen::Matrix<double,_10,_10,_0,_10,_10>_> local_4520;
  Transpose<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> local_4518;
  undefined1 local_4510 [16];
  double dStack_4500;
  double dStack_44f8;
  double dStack_44f0;
  double dStack_44e8;
  double dStack_44e0;
  double dStack_44d8;
  undefined1 local_44d0 [16];
  undefined1 local_44c0 [32];
  Matrix<double,_1,_10,_1,_1,_10> local_44a0;
  non_const_type local_4450;
  EigenvectorsType local_4440;
  EigenBase<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> local_3440 [2048];
  EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_> local_2c40;
  
  local_4548 = C;
  local_4540 = M;
  local_4538 = gamma;
  upnp::setupAction_gj(M,C,gamma,(Matrix<double,_16,_16,_0,_16,_16> *)local_3440);
  local_2c40.m_realSchur.m_hess.m_isInitialized = false;
  lVar17 = 0;
  local_2c40.m_realSchur.m_isInitialized = false;
  local_2c40.m_realSchur.m_matUisUptodate = false;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[1]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[1]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[2]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[2]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[3]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[3]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[4]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[4]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[5]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[5]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[6]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[6]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[7]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[7]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[8]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[8]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[9]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[9]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[10]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[10]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xb]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xb]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xc]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xc]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xd]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xd]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xe]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xe]._M_value._8_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xf]._M_value._0_8_ = 0;
  local_2c40.m_eivalues.super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_1,_0,_16,_1>_>
  .m_storage.m_data.array[0xf]._M_value._8_8_ = 0;
  local_2c40.m_isInitialized = false;
  local_2c40.m_eigenvectorsOk = false;
  local_2c40.m_realSchur.m_maxIters = -1;
  Eigen::EigenSolver<Eigen::Matrix<double,16,16,0,16,16>>::
  compute<Eigen::Matrix<double,16,16,0,16,16>>
            ((EigenSolver<Eigen::Matrix<double,16,16,0,16,16>> *)&local_2c40,local_3440,true);
  Eigen::EigenSolver<Eigen::Matrix<double,_16,_16,_0,_16,_16>_>::eigenvectors
            (&local_4440,&local_2c40);
  pcVar18 = local_4440.
            super_PlainObjectBase<Eigen::Matrix<std::complex<double>,_16,_16,_0,_16,_16>_>.m_storage
            .m_data.array + 0xb;
  do {
    lVar13 = 0;
    dVar25 = 0.0;
    do {
      dVar27 = *(double *)(pcVar18->_M_value + lVar13 * 2);
      *(double *)(local_4580 + lVar13) = dVar27;
      dVar25 = dVar25 + dVar27 * dVar27;
      lVar13 = lVar13 + 8;
    } while (lVar13 != 0x20);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = dVar25;
    if (dVar25 < 0.0) {
      auVar21._0_8_ = sqrt(dVar25);
      auVar21._8_56_ = extraout_var;
      auVar23 = auVar21._0_16_;
    }
    else {
      auVar23 = vsqrtsd_avx(auVar23,auVar23);
    }
    auVar20._8_8_ = 0x8000000000000000;
    auVar20._0_8_ = 0x8000000000000000;
    auVar20 = vxorpd_avx512vl(auVar23,auVar20);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_4580._0_8_;
    uVar3 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar1,0xe);
    bVar15 = (bool)((byte)uVar3 & 1);
    lVar13 = (ulong)bVar15 * auVar20._0_8_ + (ulong)!bVar15 * auVar23._0_8_;
    auVar24._8_8_ = lVar13;
    auVar24._0_8_ = lVar13;
    auVar24._16_8_ = lVar13;
    auVar24._24_8_ = lVar13;
    _local_4580 = vdivpd_avx(_local_4580,auVar24);
    ppVar2 = (quaternions->
             super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar13 = (long)(quaternions->
                   super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2;
    if (lVar13 == 0) {
LAB_00153115:
      auVar21 = vpermpd_avx512f(_DAT_001f6c80,ZEXT3264(_local_4580));
      auVar22 = vpermpd_avx512f(_DAT_001f6cc0,ZEXT3264(_local_4580));
      _local_4510 = vmulpd_avx512f(auVar21,auVar22);
      auVar23 = vshufpd_avx(local_4580,auStack_4570._0_16_,1);
      auVar4._8_8_ = auStack_4570._8_8_;
      auVar4._0_8_ = auStack_4570._8_8_;
      local_44d0 = vmulpd_avx512vl(auVar23,auVar4);
      local_4518.m_matrix = &local_44a0;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[8] = 0.0;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[9] = 0.0;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[0] = 0.0;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[1] = 0.0;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[2] = 0.0;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[3] = 0.0;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[4] = 0.0;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[5] = 0.0;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[6] = 0.0;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[7] = 0.0;
      local_4530 = 1.0;
      local_4520.m_matrix = local_4540;
      local_4528.m_matrix.m_matrix = (non_const_type)(non_const_type)local_4510;
      local_44c0._16_8_ = local_4518.m_matrix;
      Eigen::internal::gemv_dense_selector<2,1,true>::
      run<Eigen::Transpose<Eigen::Matrix<double,10,10,0,10,10>const>,Eigen::Transpose<Eigen::Transpose<Eigen::Matrix<double,10,1,0,10,1>>const>,Eigen::Transpose<Eigen::Matrix<double,1,10,1,1,10>>>
                (&local_4520,&local_4528,&local_4518,&local_4530);
      dVar25 = (local_4548->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).
               m_storage.m_data.array[0];
      dVar27 = (local_4548->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).
               m_storage.m_data.array[1];
      dVar7 = (local_4548->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage
              .m_data.array[2];
      dVar8 = (local_4548->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage
              .m_data.array[3];
      dVar9 = (local_4548->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage
              .m_data.array[4];
      dVar10 = (local_4548->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).
               m_storage.m_data.array[5];
      dVar11 = (local_4548->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).
               m_storage.m_data.array[6];
      dVar12 = (local_4548->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).
               m_storage.m_data.array[7];
      dVar5 = (local_4548->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage
              .m_data.array[8];
      dVar6 = (local_4548->super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>).m_storage
              .m_data.array[9];
      local_44c0._0_8_ =
           (double)local_4510._0_8_ *
           (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->
           m_storage).m_data.array[0] +
           dStack_4500 *
           (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->
           m_storage).m_data.array[2] +
           dStack_44f0 *
           (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->
           m_storage).m_data.array[4] +
           (double)local_44d0._0_8_ *
           (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->
           m_storage).m_data.array[8] +
           dStack_44e0 *
           (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->
           m_storage).m_data.array[6] +
           (double)local_4510._8_8_ *
           (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->
           m_storage).m_data.array[1] +
           dStack_44f8 *
           (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->
           m_storage).m_data.array[3] +
           dStack_44e8 *
           (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->
           m_storage).m_data.array[5] +
           (double)local_44d0._8_8_ *
           (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->
           m_storage).m_data.array[9] +
           dStack_44d8 *
           (((PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_> *)local_44c0._16_8_)->
           m_storage).m_data.array[7] +
           (double)local_4510._0_8_ * (dVar25 + dVar25) + dStack_4500 * (dVar7 + dVar7) +
           dStack_44f0 * (dVar9 + dVar9) +
           dStack_44e0 * (dVar11 + dVar11) + (double)local_44d0._0_8_ * (dVar5 + dVar5) +
           (double)local_4510._8_8_ * (dVar27 + dVar27) + dStack_44f8 * (dVar8 + dVar8) +
           dStack_44e8 * (dVar10 + dVar10) +
           dStack_44d8 * (dVar12 + dVar12) + (double)local_44d0._8_8_ * (dVar6 + dVar6) + local_4538
      ;
      for (__position._M_current =
                (quaternions->
                super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
          (__position._M_current !=
           (quaternions->
           super__Vector_base<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish &&
          ((__position._M_current)->first < (double)local_44c0._0_8_));
          __position._M_current = __position._M_current + 1) {
      }
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[0] = (double)local_4580._0_8_;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[1] = (double)local_4580._8_8_;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[2] = (double)auStack_4570._0_8_;
      local_44a0.super_PlainObjectBase<Eigen::Matrix<double,_1,_10,_1,_1,_10>_>.m_storage.m_data.
      array[3] = (double)auStack_4570._8_8_;
      local_4450 = (non_const_type)local_4510;
      std::
      vector<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>,_Eigen::aligned_allocator<std::pair<double,_Eigen::Matrix<double,_4,_1,_0,_4,_1>_>_>_>
      ::_M_insert_rval(quaternions,__position,(value_type *)local_44c0);
    }
    else {
      pMVar14 = &ppVar2->second;
      uVar16 = 1;
      do {
        auVar24 = vsubpd_avx(_local_4580,
                             (undefined1  [32])
                             (pMVar14->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>)
                             .m_storage.m_data);
        dVar25 = auVar24._0_8_ * auVar24._0_8_ + auVar24._16_8_ * auVar24._16_8_;
        dVar27 = auVar24._8_8_ * auVar24._8_8_ + auVar24._24_8_ * auVar24._24_8_;
        auVar26._0_8_ = dVar25 + dVar27;
        auVar26._8_8_ = dVar25 + dVar27;
        auVar23 = vsqrtsd_avx(auVar26,auVar26);
        bVar15 = false;
        if (auVar23._0_8_ < 1e-08) {
          bVar15 = true;
          break;
        }
        pMVar14 = pMVar14 + 2;
        bVar19 = uVar16 < (ulong)(lVar13 >> 6);
        uVar16 = uVar16 + 1;
      } while (bVar19);
      if (!bVar15) goto LAB_00153115;
    }
    lVar17 = lVar17 + 1;
    pcVar18 = pcVar18 + 0x10;
    if (lVar17 == 0x10) {
      return;
    }
  } while( true );
}

Assistant:

void
opengv::absolute_pose::modules::upnp_main(
    const Eigen::Matrix<double,10,10> & M,
    const Eigen::Matrix<double,1,10> & C,
    double gamma,
    std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > > & quaternions )
{
  Eigen::Matrix<double,16,16> Action;
  upnp::setupAction_gj( M, C, gamma, Action );
  Eigen::EigenSolver< Eigen::Matrix<double,16,16> > Eig( Action, true );
  Eigen::Matrix<std::complex<double>,16,16> V = Eig.eigenvectors();
  
  //cut the double solutions
  double doubleSolThreshold = 0.00000001;
  
  for( int i = 0; i < 16; i++ )
  {
    //we decided to drop the test for imaginary part
    //I've noticed that when the number of points is really low, things get a little
    //weary with noise, and complex solutions might actually be pretty good
    
    Eigen::Vector4d quaternion;
    double norm = 0.0;
    for( int q = 0; q < 4; q++ )
    {
      quaternion[q] = V(11+q,i).real();
      norm += pow(quaternion[q],2.0);
    }
    norm = sqrt(norm);
    if(quaternion[0] < 0) // this here is maybe risky, what if quaternion[0] is very small
      norm *= -1.0;
    for( int q = 0; q < 4; q++ )
      quaternion[q] /= norm;
    
    bool alreadyThere = false;
    for( size_t s = 0; s < quaternions.size(); s++ )
    {
      Eigen::Vector4d diff = quaternion - quaternions[s].second;
      if( diff.norm() < doubleSolThreshold )
      {
        alreadyThere = true;
        break;
      }
    }
    
    if( !alreadyThere )
    {
      Eigen::Matrix<double,10,1> s;
      upnp_fill_s(quaternion,s);
      Eigen::Matrix<double,1,1> valueM = s.transpose() * M * s + 2.0 * C * s;
      double value = valueM[0] + gamma;
      
      std::vector<std::pair<double,Eigen::Vector4d>,Eigen::aligned_allocator< std::pair<double,Eigen::Vector4d> > >::iterator
          qidx = quaternions.begin();
      while( qidx != quaternions.end() && qidx->first < value )
        qidx++;
      
      quaternions.insert(qidx,std::pair<double,Eigen::Vector4d>(value,quaternion));
    }
  }
}